

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

bool el::base::utils::Str::cStringCaseEq(char *s1,char *s2)

{
  int iVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  
  bVar4 = true;
  if (s1 != (char *)0x0 || s2 != (char *)0x0) {
    if (s1 == (char *)0x0 || s2 == (char *)0x0) {
      bVar4 = false;
    }
    else {
      lVar3 = 0;
      do {
        iVar1 = toupper((int)s1[lVar3]);
        iVar2 = toupper((int)s2[lVar3]);
        if (iVar1 != iVar2) break;
        lVar3 = lVar3 + 1;
      } while (iVar2 != 0);
      bVar4 = iVar1 == iVar2;
    }
  }
  return bVar4;
}

Assistant:

bool Str::cStringCaseEq(const char* s1, const char* s2) {
  if (s1 == nullptr && s2 == nullptr) return true;
  if (s1 == nullptr || s2 == nullptr) return false;

  // With thanks to cygwin for this code
  int d = 0;

  while (true) {
    const int c1 = toupper(*s1++);
    const int c2 = toupper(*s2++);

    if (((d = c1 - c2) != 0) || (c2 == '\0')) {
      break;
    }
  }

  return d == 0;
}